

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::
ContextScope<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JustWhit3[P]arsenalgear-cpp/test/unit_tests/tests_utils.cpp:53:3)>
::stringify(ContextScope<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JustWhit3[P]arsenalgear_cpp_test_unit_tests_tests_utils_cpp:53:3)>
            *this,ostream *s)

{
  ostream *s_local;
  ContextScope<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JustWhit3[P]arsenalgear_cpp_test_unit_tests_tests_utils_cpp:53:3)>
  *this_local;
  
  anon_class_8_1_03371abe_for_lambda_::operator()(&this->lambda_,s);
  return;
}

Assistant:

void stringify(std::ostream* s) const override { lambda_(s); }